

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_extract2.c
# Opt level: O1

int archive_read_extract_cleanup(archive_read *a)

{
  archive *a_00;
  int iVar1;
  
  a_00 = a->extract->ad;
  if (a_00 == (archive *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = archive_write_free(a_00);
  }
  free(a->extract);
  a->extract = (archive_read_extract *)0x0;
  return iVar1;
}

Assistant:

static int
archive_read_extract_cleanup(struct archive_read *a)
{
	int ret = ARCHIVE_OK;

	if (a->extract->ad != NULL) {
		ret = archive_write_free(a->extract->ad);
	}
	free(a->extract);
	a->extract = NULL;
	return (ret);
}